

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_3::getNumTypeInstances
              (Shader *shader,Storage storage,_func_bool_DataType *predicate)

{
  long lVar1;
  pointer pVVar2;
  int iVar3;
  pointer pIVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  pointer pIVar8;
  long lVar9;
  long lVar10;
  int varNdx_1;
  int iVar11;
  long lVar12;
  int varNdx;
  long lVar13;
  InstanceCounter local_40;
  long local_38;
  
  pIVar4 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = 0;
  lVar9 = 0;
  pIVar8 = pIVar4;
  local_40.m_predicate = predicate;
  while (lVar9 < (int)(((long)(shader->m_defaultBlock).interfaceBlocks.
                              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8) / 0x90)) {
    lVar12 = lVar9;
    if (pIVar8[lVar9].storage == storage) {
      lVar12 = *(long *)&pIVar8[lVar9].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data;
      uVar5 = (ulong)((long)*(pointer *)
                             ((long)&pIVar8[lVar9].dimensions.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                     lVar12) >> 2;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      iVar11 = 1;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        iVar11 = iVar11 * *(int *)(lVar12 + uVar5 * 4);
      }
      lVar10 = 0x20;
      local_38 = lVar9;
      for (lVar13 = 0;
          lVar1 = *(long *)&pIVar4[lVar9].variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl.super__Vector_impl_data, pIVar8 = pIVar4, lVar12 = local_38,
          lVar13 < (int)(((long)*(pointer *)
                                 ((long)&pIVar4[lVar9].variables.
                                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                         ._M_impl + 8) - lVar1) / 0x60); lVar13 = lVar13 + 1) {
        iVar3 = accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                          ((VarType *)(lVar1 + lVar10),&local_40);
        iVar7 = iVar7 + iVar3 * iVar11;
        pIVar4 = (shader->m_defaultBlock).interfaceBlocks.
                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x60;
      }
    }
    lVar9 = lVar12 + 1;
  }
  lVar9 = 0x20;
  for (lVar12 = 0;
      pVVar2 = (shader->m_defaultBlock).variables.
               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar12 < (int)(((long)(shader->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x60);
      lVar12 = lVar12 + 1) {
    if (*(Storage *)((long)pVVar2 + lVar9 + -8) == storage) {
      iVar11 = accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                         ((VarType *)((long)&(pVVar2->layout).location + lVar9),&local_40);
      iVar7 = iVar7 + iVar11;
    }
    lVar9 = lVar9 + 0x60;
  }
  return iVar7;
}

Assistant:

static int getNumTypeInstances (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage, bool (*predicate)(glu::DataType))
{
	return accumulateShader(shader, InterfaceBlockStorageFilter(storage), VariableDeclarationStorageFilter(storage), InstanceCounter(predicate));
}